

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O1

vector<long_long,_std::allocator<long_long>_> *
multiplyPolynomialsNTT
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          vector<long_long,_std::allocator<long_long>_> *a,
          vector<long_long,_std::allocator<long_long>_> *b)

{
  long *plVar1;
  iterator __position;
  pointer plVar2;
  void *pvVar3;
  byte bVar4;
  pointer puVar5;
  ulong uVar6;
  vector<long_long,_std::allocator<long_long>_> *pvVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  uint uVar12;
  pointer *this;
  bool bVar13;
  undefined1 auStack_98 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> v [2];
  vector<long_long,_std::allocator<long_long>_> *res;
  
  uVar8 = (long)(a->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(a->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)b;
  uVar6 = (long)(b->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(b->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar6 < uVar8) {
    uVar6 = uVar8;
  }
  lVar10 = 0;
  do {
    bVar4 = (byte)lVar10;
    lVar10 = lVar10 + 1;
  } while ((ulong)(long)(1 << (bVar4 & 0x1f)) < uVar6);
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar9 = 0;
  do {
    pvVar7 = (vector<long_long,_std::allocator<long_long>_> *)
             v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (lVar9 == 0) {
      pvVar7 = a;
    }
    plVar11 = (pvVar7->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    plVar1 = (pvVar7->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar11 != plVar1) {
      do {
        res = (vector<long_long,_std::allocator<long_long>_> *)
              ((*plVar11 + 0xc0000001U) % 0xc0000001);
        __position._M_current =
             v[lVar9].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        if (__position._M_current ==
            v[lVar9].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
          _M_realloc_insert<unsigned_long_long>
                    ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                     &v[lVar9 + -1].
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,__position,
                     (unsigned_long_long *)&res);
        }
        else {
          *__position._M_current = (unsigned_long_long)res;
          v[lVar9].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
          _M_impl.super__Vector_impl_data._M_start = __position._M_current + 1;
        }
        plVar11 = plVar11 + 1;
      } while (plVar11 != plVar1);
    }
    this = &v[lVar9 + -1].
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    res = (vector<long_long,_std::allocator<long_long>_> *)0x0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,
               (long)(2 << (bVar4 & 0x1f)),(value_type *)&res);
    ntt((int)lVar10,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,false);
    bVar13 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar13);
  uVar12 = 2 << (bVar4 & 0x1f);
  if (0 < (int)uVar12) {
    uVar6 = 0;
    do {
      *(ulong *)((long)auStack_98 + uVar6 * 8) =
           (v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage[uVar6] *
           *(pointer)((long)auStack_98 + uVar6 * 8)) % 0xc0000001;
      uVar6 = uVar6 + 1;
    } while (uVar12 != uVar6);
  }
  ntt((int)lVar10,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_98,true
     );
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (__return_storage_ptr__,(long)(int)uVar12,(allocator_type *)&res);
  puVar5 = inv2.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)uVar12) {
    plVar2 = (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      plVar2[uVar6] = (puVar5[lVar10] * *(pointer)((long)auStack_98 + uVar6 * 8)) % 0xc0000001;
      uVar6 = uVar6 + 1;
    } while (uVar12 != uVar6);
  }
  lVar10 = 0x18;
  do {
    pvVar3 = *(void **)((long)v + lVar10 + -8);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

vector<ll> multiplyPolynomialsNTT(vector<ll> &a, vector<ll> &b) {
    int k = 0;
    while ((1 << k) < a.size() || (1 << k) < b.size()) k++;
    k++;
    
    vector<ull> v[2];
    rep(j, 0, 2) {
        for (auto x : (j ? b : a)) v[j].push_back((x + P) % P);
        v[j].resize(1 << k, 0);
        ntt(k, v[j], false);
    }
    
    rep(i, 0, 1 << k) v[0][i] = (v[0][i] * v[1][i]) % P;
    ntt(k, v[0], true);
    vector<ll> res(1 << k);
    rep(i, 0, 1 << k) res[i] = (v[0][i] * inv2[k]) % P;
    return res;
}